

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-trapezoid-tessellator.cpp
# Opt level: O3

void __thiscall
gepard::SegmentApproximator::splitCubeCurve(SegmentApproximator *this,FloatPoint *points)

{
  double y_;
  FloatPoint local_98;
  double local_88;
  double dStack_80;
  double local_78;
  Float FStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  double local_28;
  double dStack_20;
  
  local_28 = points->x;
  dStack_20 = points->y;
  local_38 = points[3].x;
  dStack_40 = points[3].y;
  local_88 = points[1].x + points[2].x;
  local_78 = points[1].y + points[2].y;
  local_68 = points[2].x + local_38;
  local_48 = dStack_40 + points[2].y;
  dStack_30 = dStack_40;
  FloatPoint::FloatPoint(&local_98,local_28 + points[1].x,dStack_20 + points[1].y);
  FloatPoint::FloatPoint(&local_98,local_98.x * 0.5,local_98.y * 0.5);
  local_58 = local_98.x;
  dStack_50 = local_98.y;
  FloatPoint::FloatPoint(&local_98,local_88,local_78);
  FloatPoint::FloatPoint(&local_98,local_98.x * 0.5,local_98.y * 0.5);
  local_78 = local_98.x;
  local_88 = local_98.y;
  FloatPoint::FloatPoint(&local_98,local_68,local_48);
  FloatPoint::FloatPoint(&local_98,local_98.x * 0.5,local_98.y * 0.5);
  local_68 = local_98.x;
  dStack_60 = local_98.y;
  FloatPoint::FloatPoint(&local_98,local_58 + local_78,dStack_50 + local_88);
  FloatPoint::FloatPoint(&local_98,local_98.x * 0.5,local_98.y * 0.5);
  y_ = dStack_60 + local_88;
  local_88 = local_98.x;
  dStack_80 = local_98.y;
  FloatPoint::FloatPoint(&local_98,local_78 + local_68,y_);
  FloatPoint::FloatPoint(&local_98,local_98.x * 0.5,local_98.y * 0.5);
  local_78 = local_98.x;
  FStack_70 = local_98.y;
  FloatPoint::FloatPoint(&local_98,local_88 + local_98.x,dStack_80 + local_98.y);
  FloatPoint::FloatPoint(&local_98,local_98.x * 0.5,local_98.y * 0.5);
  points->x = local_28;
  points->y = dStack_20;
  points[1].x = local_58;
  points[1].y = dStack_50;
  points[2].x = local_88;
  points[2].y = dStack_80;
  points[3].x = local_98.x;
  points[3].y = local_98.y;
  points[4].x = local_78;
  points[4].y = FStack_70;
  points[5].x = local_68;
  points[5].y = dStack_60;
  points[6].x = local_38;
  points[6].y = dStack_30;
  return;
}

Assistant:

void SegmentApproximator::splitCubeCurve(FloatPoint points[])
{
    const FloatPoint a = points[0];
    const FloatPoint b = points[1];
    const FloatPoint c = points[2];
    const FloatPoint d = points[3];
    const FloatPoint ab = (a + b) / 2.0;
    const FloatPoint bc = (b + c) / 2.0;
    const FloatPoint cd = (c + d) / 2.0;
    const FloatPoint abbc = (ab + bc) / 2.0;
    const FloatPoint bccd = (bc + cd) / 2.0;
    const FloatPoint mid = (abbc + bccd) / 2.0;

    points[0] = a;
    points[1] = ab;
    points[2] = abbc;
    points[3] = mid;
    points[4] = bccd;
    points[5] = cd;
    points[6] = d;
}